

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O0

void __thiscall
BoundaryElement::matrix_vector
          (BoundaryElement *this,double alpha,double *potential_old,double beta,
          double *potential_new)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  reference puVar4;
  size_type sVar5;
  void *in_RDX;
  long in_RSI;
  size_t in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  size_t unaff_retaddr;
  double *in_stack_00000008;
  BoundaryElement *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  double *in_stack_00000040;
  double *in_stack_00000048;
  BoundaryElement *in_stack_00000050;
  size_t i_1;
  size_t i;
  unsigned_long source_node_idx_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2_3;
  unsigned_long source_node_idx_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2_2;
  unsigned_long source_node_idx_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2_1;
  unsigned_long source_node_idx;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  size_t target_node_idx;
  double *potential_temp;
  size_t potential_num;
  double potential_coeff_2;
  double potential_coeff_1;
  BoundaryElement *in_stack_000001d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe88;
  Tree *in_stack_fffffffffffffe90;
  Timer *this_00;
  ulong local_120;
  Timer *local_118;
  BoundaryElement *in_stack_fffffffffffffef0;
  double *in_stack_fffffffffffffef8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff00;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_c8;
  _Type local_c0;
  unsigned_long local_b0;
  unsigned_long *local_a8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_98;
  _Type local_90;
  _Type local_80;
  unsigned_long local_70;
  unsigned_long *local_68;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  ulong local_50;
  void *local_48;
  size_type local_40;
  double local_38;
  double local_30;
  void *local_28;
  double local_20;
  long local_18;
  double local_10;
  size_t source_node_idx_00;
  
  local_28 = in_RDX;
  local_20 = in_XMM1_Qa;
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  source_node_idx_00 = in_RDI;
  Timer::start((Timer *)in_stack_fffffffffffffe90);
  local_30 = (*(double *)(*(long *)(in_RDI + 0x28) + 0x278) + 1.0) * 0.5;
  local_38 = (1.0 / *(double *)(*(long *)(in_RDI + 0x28) + 0x278) + 1.0) * 0.5;
  local_40 = std::vector<double,_std::allocator<double>_>::size
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40));
  local_48 = malloc(local_40 << 3);
  memcpy(local_48,local_28,local_40 << 3);
  memset(local_28,0,local_40 << 3);
  clear_cluster_charges(in_stack_fffffffffffffef0);
  clear_cluster_potentials(in_stack_fffffffffffffef0);
  Elements::compute_charges
            ((Elements *)in_stack_ffffffffffffff00._M_current,in_stack_fffffffffffffef8);
  upward_pass(in_stack_000001d0);
  local_50 = 0;
  while( true ) {
    uVar1 = local_50;
    sVar3 = Tree::num_nodes(*(Tree **)(in_RDI + 0x10));
    if (sVar3 <= uVar1) break;
    local_58 = InteractionList::particle_particle
                         ((InteractionList *)in_stack_fffffffffffffe90,
                          (size_t)in_stack_fffffffffffffe88);
    local_60._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_fffffffffffffe88);
    local_68 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         (in_stack_fffffffffffffe88);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffe90,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffe88);
      if (!bVar2) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_60);
      local_70 = *puVar4;
      local_80 = (_Type)Tree::node_particle_idxs
                                  (in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
      local_90 = (_Type)Tree::node_particle_idxs
                                  (in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe88 =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90[0];
      in_stack_fffffffffffffe90 = (Tree *)local_90[1];
      particle_particle_interact
                (in_stack_00000050,in_stack_00000048,in_stack_00000040,
                 (array<unsigned_long,_2UL>)_i_1,(array<unsigned_long,_2UL>)___end2_3);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_60);
    }
    local_98 = InteractionList::particle_cluster
                         ((InteractionList *)in_stack_fffffffffffffe90,
                          (size_t)in_stack_fffffffffffffe88);
    local_a0._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_fffffffffffffe88);
    local_a8 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         (in_stack_fffffffffffffe88);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffe90,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffe88);
      if (!bVar2) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_a0);
      local_b0 = *puVar4;
      local_c0 = (_Type)Tree::node_particle_idxs
                                  (in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
      particle_cluster_interact
                (in_stack_00000010,in_stack_00000008,(array<unsigned_long,_2UL>)in_stack_00000018,
                 unaff_retaddr);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_a0);
    }
    local_c8 = InteractionList::cluster_particle
                         ((InteractionList *)in_stack_fffffffffffffe90,
                          (size_t)in_stack_fffffffffffffe88);
    local_d0._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_fffffffffffffe88);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffe88);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffe90,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffe88);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(&local_d0);
      Tree::node_particle_idxs(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
      cluster_particle_interact
                (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                 (array<unsigned_long,_2UL>)in_stack_00000018);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_d0);
    }
    InteractionList::cluster_cluster
              ((InteractionList *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffe88);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffe88);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffe90,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffe88);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)&stack0xffffffffffffff00);
      cluster_cluster_interact(in_stack_00000010,in_stack_00000008,unaff_retaddr,source_node_idx_00)
      ;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&stack0xffffffffffffff00);
    }
    local_50 = local_50 + 1;
  }
  downward_pass((BoundaryElement *)__end2_1._M_current,(double *)source_node_idx_1);
  local_118 = (Timer *)0x0;
  while( true ) {
    this_00 = local_118;
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40));
    if ((Timer *)(sVar5 >> 1) <= this_00) break;
    *(double *)((long)local_28 + (long)local_118 * 8) =
         local_20 * *(double *)((long)local_48 + (long)local_118 * 8) +
         local_10 *
         (local_30 * *(double *)(local_18 + (long)local_118 * 8) +
         -*(double *)((long)local_28 + (long)local_118 * 8));
    local_118 = (Timer *)((long)&(local_118->start_time_).__d.__r + 1);
  }
  sVar5 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40));
  local_120 = sVar5 >> 1;
  while( true ) {
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40));
    if (sVar5 <= local_120) break;
    *(double *)((long)local_28 + local_120 * 8) =
         local_20 * *(double *)((long)local_48 + local_120 * 8) +
         local_10 *
         (local_38 * *(double *)(local_18 + local_120 * 8) +
         -*(double *)((long)local_28 + local_120 * 8));
    local_120 = local_120 + 1;
  }
  free(local_48);
  Timer::stop(this_00);
  return;
}

Assistant:

void BoundaryElement::matrix_vector(double alpha, const double* __restrict potential_old,
                                     double beta,       double* __restrict potential_new)
{
    timers_.matrix_vector.start();

    double potential_coeff_1 = 0.5 * (1. +      params_.phys_eps_);
    double potential_coeff_2 = 0.5 * (1. + 1. / params_.phys_eps_);
    
    std::size_t potential_num = potential_.size();
    auto* potential_temp = (double *)std::malloc(potential_num * sizeof(double));
    std::memcpy(potential_temp, potential_new, potential_num * sizeof(double));
    std::memset(potential_new, 0, potential_num * sizeof(double));

#ifdef OPENACC_ENABLED
    #pragma acc enter data copyin(potential_old[0:potential_num], \
                                  potential_new[0:potential_num])
#endif

    BoundaryElement::clear_cluster_charges();
    BoundaryElement::clear_cluster_potentials();

    elements_.compute_charges(potential_old);
    BoundaryElement::upward_pass();

#ifdef OPENMP_ENABLED
    #pragma omp parallel for
#endif
    for (std::size_t target_node_idx = 0; target_node_idx < tree_.num_nodes(); ++target_node_idx) {
        
        for (auto source_node_idx : interaction_list_.particle_particle(target_node_idx))
            BoundaryElement::particle_particle_interact(potential_new, potential_old,
                    tree_.node_particle_idxs(target_node_idx), tree_.node_particle_idxs(source_node_idx));
    
        for (auto source_node_idx : interaction_list_.particle_cluster(target_node_idx))
            BoundaryElement::particle_cluster_interact(potential_new, 
                    tree_.node_particle_idxs(target_node_idx), source_node_idx);
        
        for (auto source_node_idx : interaction_list_.cluster_particle(target_node_idx))
            BoundaryElement::cluster_particle_interact(potential_new, 
                    target_node_idx, tree_.node_particle_idxs(source_node_idx));
        
        for (auto source_node_idx : interaction_list_.cluster_cluster(target_node_idx))
            BoundaryElement::cluster_cluster_interact(potential_new, target_node_idx, source_node_idx);
    }

#ifdef OPENACC_ENABLED
    #pragma acc wait
#endif
    
#ifdef OPENACC_ENABLED
    #pragma acc wait
#endif
    
    BoundaryElement::downward_pass(potential_new);

#ifdef OPENACC_ENABLED
    #pragma acc exit data copyout(potential_old[0:potential_num], \
                                  potential_new[0:potential_num])
#endif
    
    for (std::size_t i = 0; i < potential_.size() / 2; ++i)
        potential_new[i] = beta * potential_temp[i]
                + alpha * (potential_coeff_1 * potential_old[i] - potential_new[i]);
                                             
    for (std::size_t i = potential_.size() / 2; i < potential_.size(); ++i)
        potential_new[i] =  beta * potential_temp[i]
                + alpha * (potential_coeff_2 * potential_old[i] - potential_new[i]);
                
    std::free(potential_temp);

    timers_.matrix_vector.stop();
}